

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

SimpleString __thiscall MockSupport::appendScopeToName(MockSupport *this,SimpleString *functionName)

{
  bool bVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  SimpleString SVar3;
  SimpleString local_40;
  SimpleString local_30;
  SimpleString *local_20;
  SimpleString *functionName_local;
  MockSupport *this_local;
  
  local_20 = in_RDX;
  functionName_local = functionName;
  this_local = this;
  bVar1 = SimpleString::isEmpty(functionName + 7);
  if (bVar1) {
    SimpleString::SimpleString((SimpleString *)this,local_20);
    sVar2 = extraout_RDX;
  }
  else {
    SimpleString::SimpleString(&local_40,"::");
    SimpleString::operator+(&local_30,functionName + 7);
    SimpleString::operator+((SimpleString *)this,&local_30);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_40);
    sVar2 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString MockSupport::appendScopeToName(const SimpleString& functionName)
{
    if (mockName_.isEmpty()) return functionName;
    return mockName_ + "::" + functionName;
}